

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O1

void av1_estimate_block_intra
               (int plane,int block,int row,int col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,void *arg
               )

{
  BLOCK_SIZE bsize;
  int iVar1;
  int iVar2;
  uint uVar3;
  AV1_COMP *cpi;
  MACROBLOCK *x;
  uint8_t *puVar4;
  uint8_t *puVar5;
  undefined4 *puVar6;
  int *piVar7;
  uint uVar8;
  TX_SIZE tx_size_00;
  undefined7 in_register_00000089;
  buf_2d *pbVar9;
  buf_2d *pbVar10;
  RD_STATS this_rdc;
  RD_STATS local_58;
  
  cpi = *arg;
  x = *(MACROBLOCK **)((long)arg + 8);
  bsize = txsize_to_bsize[CONCAT71(in_register_00000089,tx_size) & 0xffffffff];
  pbVar9 = &x->plane[plane].src;
  pbVar10 = &(x->e_mbd).plane[plane].dst;
  puVar4 = pbVar9->buf;
  puVar5 = pbVar10->buf;
  iVar1 = x->plane[plane].src.stride;
  iVar2 = (x->e_mbd).plane[plane].dst.stride;
  av1_predict_intra_block_facade(&cpi->common,&x->e_mbd,plane,col,row,tx_size);
  if ((*(char *)((long)arg + 0x24) != '\0') || (*(char *)((long)arg + 0x25) == '\x01')) {
    uVar8 = (*cpi->ppi->fn_ptr[plane_bsize].sdf)
                      (pbVar9->buf,x->plane[plane].src.stride,pbVar10->buf,
                       (x->e_mbd).plane[plane].dst.stride);
    uVar3 = *(uint *)((long)arg + 0x20);
    if ((*(char *)((long)arg + 0x24) == '\x01') &&
       ((uVar3 != 0xffffffff && ((uVar3 >> 4) + uVar3 < uVar8)))) {
      puVar6 = *(undefined4 **)((long)arg + 0x18);
      *puVar6 = 0x7fffffff;
      *(undefined8 *)(puVar6 + 2) = 0x7fffffffffffffff;
      return;
    }
    if (uVar8 < uVar3) {
      *(uint *)((long)arg + 0x20) = uVar8;
    }
  }
  local_58.rate = 0x7fffffff;
  local_58.zero_rate = 0;
  local_58.dist = 0x7fffffffffffffff;
  local_58.rdcost = 0x7fffffffffffffff;
  local_58.sse = 0x7fffffffffffffff;
  local_58.skip_txfm = '\0';
  pbVar9->buf = puVar4 + ((long)iVar1 * (long)row + (long)col) * 4;
  pbVar10->buf = puVar5 + ((long)iVar2 * (long)row + (long)col) * 4;
  if (plane == 0) {
    tx_size_00 = '\x02';
    if (tx_size < 2) {
      tx_size_00 = tx_size;
    }
    av1_block_yrd(x,&local_58,(int *)((long)arg + 0x14),bsize,tx_size_00);
  }
  else {
    av1_model_rd_for_sb_uv(cpi,bsize,x,&x->e_mbd,&local_58,plane,plane);
  }
  pbVar9->buf = puVar4;
  pbVar10->buf = puVar5;
  piVar7 = *(int **)((long)arg + 0x18);
  *piVar7 = *piVar7 + local_58.rate;
  *(long *)(piVar7 + 2) = *(long *)(piVar7 + 2) + local_58.dist;
  return;
}

Assistant:

void av1_estimate_block_intra(int plane, int block, int row, int col,
                              BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                              void *arg) {
  struct estimate_block_intra_args *const args = arg;
  AV1_COMP *const cpi = args->cpi;
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const BLOCK_SIZE bsize_tx = txsize_to_bsize[tx_size];
  uint8_t *const src_buf_base = p->src.buf;
  uint8_t *const dst_buf_base = pd->dst.buf;
  const int64_t src_stride = p->src.stride;
  const int64_t dst_stride = pd->dst.stride;

  (void)block;

  av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);

  if (args->prune_mode_based_on_sad || args->prune_palette_sad) {
    unsigned int this_sad = cpi->ppi->fn_ptr[plane_bsize].sdf(
        p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride);
    const unsigned int sad_threshold =
        args->best_sad != UINT_MAX ? args->best_sad + (args->best_sad >> 4)
                                   : UINT_MAX;
    // Skip the evaluation of current mode if its SAD is more than a threshold.
    if (args->prune_mode_based_on_sad && this_sad > sad_threshold) {
      // For the current mode, set rate and distortion to maximum possible
      // values and return.
      // Note: args->rdc->rate is checked in av1_nonrd_pick_intra_mode() to skip
      // the evaluation of the current mode.
      args->rdc->rate = INT_MAX;
      args->rdc->dist = INT64_MAX;
      return;
    }
    if (this_sad < args->best_sad) {
      args->best_sad = this_sad;
    }
  }

  RD_STATS this_rdc;
  av1_invalid_rd_stats(&this_rdc);

  p->src.buf = &src_buf_base[4 * (row * src_stride + col)];
  pd->dst.buf = &dst_buf_base[4 * (row * dst_stride + col)];

  if (plane == 0) {
    av1_block_yrd(x, &this_rdc, &args->skippable, bsize_tx,
                  AOMMIN(tx_size, TX_16X16));
  } else {
    av1_model_rd_for_sb_uv(cpi, bsize_tx, x, xd, &this_rdc, plane, plane);
  }

  p->src.buf = src_buf_base;
  pd->dst.buf = dst_buf_base;
  assert(args->rdc->rate != INT_MAX && args->rdc->dist != INT64_MAX);
  args->rdc->rate += this_rdc.rate;
  args->rdc->dist += this_rdc.dist;
}